

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O1

Enum __thiscall
ViconDataStreamSDK::Core::VClient::SetTimingLog
          (VClient *this,string *i_rClientLog,string *i_rCGStreamLog)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  VClientTimingLog *pVVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  char cVar5;
  Enum EVar7;
  undefined1 local_39;
  VClientTimingLog *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  int iVar6;
  
  if ((this->m_pTimingLog).
      super___shared_ptr<ViconDataStreamSDK::Core::VClientTimingLog,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    local_38 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<ViconDataStreamSDK::Core::VClientTimingLog,std::allocator<ViconDataStreamSDK::Core::VClientTimingLog>>
              (&_Stack_30,&local_38,
               (allocator<ViconDataStreamSDK::Core::VClientTimingLog> *)&local_39);
    _Var3._M_pi = _Stack_30._M_pi;
    pVVar2 = local_38;
    local_38 = (VClientTimingLog *)0x0;
    _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->m_pTimingLog).
              super___shared_ptr<ViconDataStreamSDK::Core::VClientTimingLog,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (this->m_pTimingLog).
    super___shared_ptr<ViconDataStreamSDK::Core::VClientTimingLog,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = pVVar2;
    (this->m_pTimingLog).
    super___shared_ptr<ViconDataStreamSDK::Core::VClientTimingLog,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var3._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
    }
  }
  bVar4 = VClientTimingLog::CreateLog
                    ((this->m_pTimingLog).
                     super___shared_ptr<ViconDataStreamSDK::Core::VClientTimingLog,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,i_rClientLog);
  peVar1 = (this->m_pClient).
           super___shared_ptr<ViconCGStreamClientSDK::ICGClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    std::__cxx11::string::_M_assign((string *)&this->m_ClientLogFile);
    cVar5 = '\x01';
  }
  else {
    iVar6 = (*peVar1->_vptr_ICGClient[0x18])(peVar1,i_rCGStreamLog);
    cVar5 = (char)iVar6;
  }
  EVar7 = Success;
  if (cVar5 == '\0') {
    EVar7 = InvalidOperation;
  }
  if (!bVar4) {
    EVar7 = InvalidOperation;
  }
  return EVar7;
}

Assistant:

Result::Enum VClient::SetTimingLog(const std::string & i_rClientLog, const std::string & i_rCGStreamLog )
{
  if (!m_pTimingLog)
  {
    m_pTimingLog = std::make_shared< VClientTimingLog >();
  }

  bool bClientLogOk = m_pTimingLog->CreateLog(i_rClientLog);
  bool bCGStreamLogOK = true;
  if( m_pClient )
  {
    bCGStreamLogOK = m_pClient->SetLogFile(i_rCGStreamLog);
  }
  else
  {
    m_ClientLogFile = i_rCGStreamLog;
  }

  Result::Enum Output = ( bClientLogOk && bCGStreamLogOK ) ? Result::Success : Result::InvalidOperation;
  return Output;
}